

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itread.c
# Opt level: O3

int readblock(DUMBFILE *f,readblock_crap *crap)

{
  uint n;
  int32 iVar1;
  uchar *puVar2;
  uint uVar3;
  
  n = dumbfile_igetw(f);
  uVar3 = n;
  if (-1 < (int)n) {
    puVar2 = (uchar *)malloc((ulong)n);
    crap->sourcebuf = puVar2;
    uVar3 = 0xffffffff;
    if (puVar2 != (uchar *)0x0) {
      iVar1 = dumbfile_getnc((char *)puVar2,n,f);
      puVar2 = crap->sourcebuf;
      if (iVar1 < (int)n) {
        free(puVar2);
        crap->sourcebuf = (uchar *)0x0;
      }
      else {
        crap->sourcepos = puVar2;
        crap->sourceend = puVar2 + n;
        crap->rembits = 8;
        uVar3 = 0;
      }
    }
  }
  return uVar3;
}

Assistant:

static int readblock(DUMBFILE *f, readblock_crap * crap)
{
	int32 size;
	int c;

	size = dumbfile_igetw(f);
	if (size < 0)
		return size;

	crap->sourcebuf = malloc(size);
	if (!crap->sourcebuf)
		return -1;

	c = dumbfile_getnc((char *)crap->sourcebuf, size, f);
	if (c < size) {
		free(crap->sourcebuf);
		crap->sourcebuf = NULL;
		return -1;
	}

	crap->sourcepos = crap->sourcebuf;
	crap->sourceend = crap->sourcebuf + size;
	crap->rembits = 8;
	return 0;
}